

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase84::run(TestCase84 *this)

{
  MonotonicClock *pMVar1;
  MonotonicClock *pMVar2;
  TimePoint TVar3;
  long lVar4;
  DebugComparison<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_&,_kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>_>
  _kjCondition;
  Quantity<long,_kj::_::NanosecondLabel> local_30;
  TimePoint p;
  
  pMVar1 = systemCoarseMonotonicClock();
  pMVar2 = systemPreciseMonotonicClock();
  TVar3.value.value =
       (Quantity<long,_kj::_::NanosecondLabel>)(*(code *)**(undefined8 **)pMVar2)(pMVar2);
  p.value.value = TVar3.value.value;
  lVar4 = (*(code *)**(undefined8 **)pMVar1)(pMVar1);
  _kjCondition.right.value.value = (Quantity<long,_kj::_::NanosecondLabel>)(lVar4 + 40000000);
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = (long)TVar3.value.value < (long)_kjCondition.right.value.value;
  if (_::Debug::minSeverity < 3 && (long)_kjCondition.right.value.value <= (long)TVar3.value.value)
  {
    local_30.value = (long)TVar3.value.value - lVar4;
    _kjCondition.left = &p;
    _::Debug::
    log<char_const(&)[47],kj::_::DebugComparison<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>&,kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>&,kj::Quantity<long,kj::_::NanosecondLabel>>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/time-test.c++"
               ,0x5f,ERROR,
               "\"failed: expected \" \"p < c + 40 * kj::MILLISECONDS\", _kjCondition, p - c",
               (char (*) [47])"failed: expected p < c + 40 * kj::MILLISECONDS",&_kjCondition,
               &local_30);
    TVar3 = p;
  }
  _kjCondition.right.value.value = (Quantity<long,_kj::_::NanosecondLabel>)(lVar4 + -40000000);
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = (long)_kjCondition.right.value.value < (long)TVar3.value.value;
  if (((long)TVar3.value.value <= (long)_kjCondition.right.value.value) &&
     (_::Debug::minSeverity < 3)) {
    local_30 = lVar4 - TVar3.value.value;
    _kjCondition.left = &p;
    _::Debug::
    log<char_const(&)[47],kj::_::DebugComparison<kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>&,kj::Absolute<kj::Quantity<long,kj::_::NanosecondLabel>,kj::_::TimeLabel>>&,kj::Quantity<long,kj::_::NanosecondLabel>>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/time-test.c++"
               ,0x60,ERROR,
               "\"failed: expected \" \"p > c - 40 * kj::MILLISECONDS\", _kjCondition, c - p",
               (char (*) [47])"failed: expected p > c - 40 * kj::MILLISECONDS",&_kjCondition,
               &local_30);
  }
  return;
}

Assistant:

TEST(Memory, Attach) {
  uint counter = 0;
  uint destroyed1 = 0;
  uint destroyed2 = 0;
  uint destroyed3 = 0;

  auto obj1 = kj::heap<DestructionOrderRecorder>(counter, destroyed1);
  auto obj2 = kj::heap<DestructionOrderRecorder>(counter, destroyed2);
  auto obj3 = kj::heap<DestructionOrderRecorder>(counter, destroyed3);

  auto ptr = obj1.get();

  Own<DestructionOrderRecorder> combined = obj1.attach(kj::mv(obj2), kj::mv(obj3));

  KJ_EXPECT(combined.get() == ptr);

  KJ_EXPECT(obj1.get() == nullptr);
  KJ_EXPECT(obj2.get() == nullptr);
  KJ_EXPECT(obj3.get() == nullptr);
  KJ_EXPECT(destroyed1 == 0);
  KJ_EXPECT(destroyed2 == 0);
  KJ_EXPECT(destroyed3 == 0);

  combined = nullptr;

  KJ_EXPECT(destroyed1 == 1, destroyed1);
  KJ_EXPECT(destroyed2 == 2, destroyed2);
  KJ_EXPECT(destroyed3 == 3, destroyed3);
}